

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void temp_load(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet desired_regs,TCGRegSet allocated_regs,
              TCGRegSet preferred_regs)

{
  TCGReg local_28;
  TCGReg reg;
  TCGRegSet preferred_regs_local;
  TCGRegSet allocated_regs_local;
  TCGRegSet desired_regs_local;
  TCGTemp *ts_local;
  TCGContext_conflict9 *s_local;
  
  switch(ts->field_0x1) {
  case 0:
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
            ,0xc03);
    abort();
  case 1:
    return;
  case 2:
    local_28 = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,
                             (*(ulong *)ts >> 0x22 & 1) != 0);
    tcg_out_ld(s,(TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x18) & 0xff,local_28,
               (TCGReg)*(undefined8 *)ts->mem_base & 0xff,ts->mem_offset);
    *(ulong *)ts = *(ulong *)ts & 0xfffffff7ffffffff | 0x800000000;
    break;
  case 3:
    local_28 = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,
                             (*(ulong *)ts >> 0x22 & 1) != 0);
    tcg_out_movi(s,(TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x18) & 0xff,local_28,ts->val);
    *(ulong *)ts = *(ulong *)ts & 0xfffffff7ffffffff;
  }
  *(ulong *)ts = *(ulong *)ts & 0xffffffffffffff00 | (ulong)local_28 & 0xff;
  *(ulong *)ts = *(ulong *)ts & 0xffffffffffff00ff | 0x100;
  s->reg_to_temp[local_28] = ts;
  return;
}

Assistant:

static void temp_load(TCGContext *s, TCGTemp *ts, TCGRegSet desired_regs,
                      TCGRegSet allocated_regs, TCGRegSet preferred_regs)
{
    TCGReg reg;

    switch (ts->val_type) {
    case TEMP_VAL_REG:
        return;
    case TEMP_VAL_CONST:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_movi(s, ts->type, reg, ts->val);
        ts->mem_coherent = 0;
        break;
    case TEMP_VAL_MEM:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_ld(s, ts->type, reg, ts->mem_base->reg, ts->mem_offset);
        ts->mem_coherent = 1;
        break;
    case TEMP_VAL_DEAD:
    default:
        tcg_abort();
    }
    ts->reg = reg;
    ts->val_type = TEMP_VAL_REG;
    s->reg_to_temp[reg] = ts;
}